

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_exp2anyreg(FuncState *fs,expdesc *e)

{
  expdesc *in_RSI;
  FuncState *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  luaK_dischargevars(in_RDI,in_RSI);
  if (in_RSI->k == VNONRELOC) {
    if (in_RSI->t == in_RSI->f) {
      return (in_RSI->u).s.info;
    }
    if ((int)(uint)in_RDI->nactvar <= (in_RSI->u).s.info) {
      exp2reg((FuncState *)e,
              (expdesc *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
              (int)((ulong)in_RDI >> 0x20));
      return (in_RSI->u).s.info;
    }
  }
  luaK_exp2nextreg(in_RDI,in_RSI);
  return (in_RSI->u).s.info;
}

Assistant:

static int luaK_exp2anyreg(FuncState*fs,expdesc*e){
luaK_dischargevars(fs,e);
if(e->k==VNONRELOC){
if(!hasjumps(e))return e->u.s.info;
if(e->u.s.info>=fs->nactvar){
exp2reg(fs,e,e->u.s.info);
return e->u.s.info;
}
}
luaK_exp2nextreg(fs,e);
return e->u.s.info;
}